

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_script.cpp
# Opt level: O1

int CfdFreeTaprootScriptTreeHandle(void *handle,void *tree_handle)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_> *this;
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *this_00;
  string local_48;
  
  cfd::Initialize();
  if (tree_handle != (void *)0x0) {
    paVar1 = &local_48.field_2;
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"TapscriptTree","");
    cfd::capi::CheckBuffer(tree_handle,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    this = *(vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_> **)
            ((long)tree_handle + 0x10);
    if (this != (vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>
                 *)0x0) {
      std::vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>::
      ~vector(this);
      operator_delete(this,0x18);
      *(undefined8 *)((long)tree_handle + 0x10) = 0;
    }
    this_00 = *(vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> **)
               ((long)tree_handle + 0x18);
    if (this_00 != (vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *)0x0) {
      std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::~vector(this_00);
      operator_delete(this_00,0x18);
      *(undefined8 *)((long)tree_handle + 0x18) = 0;
    }
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"TapscriptTree","");
    cfd::capi::FreeBuffer(tree_handle,&local_48,0x28);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  return 0;
}

Assistant:

int CfdFreeTaprootScriptTreeHandle(void* handle, void* tree_handle) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (tree_handle != nullptr) {
      CheckBuffer(tree_handle, kPrefixTapscriptTree);
      CfdCapiTapscriptTree* data =
          static_cast<CfdCapiTapscriptTree*>(tree_handle);
      if (data->tree_buffer != nullptr) {
        delete data->tree_buffer;
        data->tree_buffer = nullptr;
      }
      if (data->branch_buffer != nullptr) {
        delete data->branch_buffer;
        data->branch_buffer = nullptr;
      }
      FreeBuffer(
          tree_handle, kPrefixTapscriptTree, sizeof(CfdCapiTapscriptTree));
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}